

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

NavigationState * __thiscall
despot::MemoryPool<despot::NavigationState>::Allocate(MemoryPool<despot::NavigationState> *this)

{
  value_type pNVar1;
  bool bVar2;
  reference ppNVar3;
  NavigationState *obj;
  MemoryPool<despot::NavigationState> *this_local;
  
  bVar2 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::empty
                    (&this->freelist_);
  if (bVar2) {
    NewChunk(this);
  }
  ppNVar3 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::back
                      (&this->freelist_);
  pNVar1 = *ppNVar3;
  std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::pop_back
            (&this->freelist_);
  bVar2 = MemoryObject::IsAllocated((MemoryObject *)&pNVar1->field_0x8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    MemoryObject::SetAllocated((MemoryObject *)&pNVar1->field_0x8);
    this->num_allocated_ = this->num_allocated_ + 1;
    return pNVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::NavigationState>::Allocate() [T = despot::NavigationState]"
               );
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}